

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

void btreeblk_reset_subblock_info(btreeblk_handle *handle)

{
  btreeblk_subblocks *pbVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (handle->nsb != 0) {
    uVar3 = 0;
    do {
      if (handle->sb[uVar3].bid != 0xffffffffffffffff) {
        pbVar1 = handle->sb + uVar3;
        if (pbVar1->nblocks != 0) {
          uVar2 = 0;
          do {
            if (pbVar1->bitmap[uVar2] == '\0') {
              filemgr_add_stale_block
                        (handle->file,
                         (ulong)((int)uVar2 * pbVar1->sb_size) +
                         (ulong)handle->nodesize * pbVar1->bid,(ulong)pbVar1->sb_size);
            }
            uVar2 = uVar2 + 1;
            pbVar1 = handle->sb + uVar3;
          } while (uVar2 < pbVar1->nblocks);
        }
        pbVar1->bid = 0xffffffffffffffff;
      }
      memset(handle->sb[uVar3].bitmap,0,(ulong)handle->sb[uVar3].nblocks);
      uVar3 = uVar3 + 1;
    } while (uVar3 < handle->nsb);
  }
  return;
}

Assistant:

void btreeblk_reset_subblock_info(struct btreeblk_handle *handle)
{
#ifdef __BTREEBLK_SUBBLOCK
    uint32_t sb_no, idx;

    for (sb_no=0;sb_no<handle->nsb;++sb_no){
        if (handle->sb[sb_no].bid != BLK_NOT_FOUND) {
            // first of all, make all unused subblocks as stale
            for (idx=0; idx<handle->sb[sb_no].nblocks; ++idx) {
                if (handle->sb[sb_no].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[sb_no].bid * handle->nodesize)
                            + (idx * handle->sb[sb_no].sb_size),
                        handle->sb[sb_no].sb_size);
                }
            }
            handle->sb[sb_no].bid = BLK_NOT_FOUND;
        }
        // clear all info in each subblock set
        memset(handle->sb[sb_no].bitmap, 0, handle->sb[sb_no].nblocks);
    }
#endif
}